

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

double hungarian_algorithm::
       solveBruteForce<double,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
                 (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *cost_function,unsigned_long num_rows,unsigned_long num_cols,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
                 less<double> *cost_comparator,double *zero_cost)

{
  double dVar1;
  BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
  solver;
  BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
  local_b0;
  CombinedCost local_20;
  
  BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
  ::BruteForceSolver(&local_b0,cost_function,num_rows,num_cols,cost_comparator,zero_cost);
  local_20.first = 0;
  local_20.second = local_b0.zero_cost_;
  BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
  ::doSolve(&local_b0,0,&local_20);
  dVar1 = BruteForceSolver<double,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::less<double>,unsigned_long>
          ::getAssignment<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((BruteForceSolver<double,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::less<double>,unsigned_long>
                      *)&local_b0,assignment_map);
  if (local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_b0.covered_cols_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_b0.optimal_assignment_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.optimal_assignment_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.current_assignment_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.current_assignment_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar1;
}

Assistant:

Cost solveBruteForce(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                     AssignmentMap& assignment_map, const CostComparator& cost_comparator, const Cost& zero_cost)
{
  BruteForceSolver<Cost, CostFunction, CostComparator, Size> solver(
    cost_function, num_rows, num_cols, cost_comparator, zero_cost);
  solver.solve();
  return solver.getAssignment(assignment_map);
}